

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

expected<const_Command::Arg_*,_Commands::MatchFailure> *
match_arg(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
         Commands *commands,shared_ptr<const_SyntaxTree> *hint,TagVar *arg,Arg *arginfo,
         SymTable *symtable,shared_ptr<Scope> *scope_ptr,Options *options)

{
  ushort uVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Reason RVar6;
  runtime_error *this;
  Reason RVar7;
  char *__function;
  element_type *extraout_RDX;
  element_type *extraout_RDX_00;
  element_type *extraout_RDX_01;
  element_type *extraout_RDX_02;
  element_type *extraout_RDX_03;
  element_type *extraout_RDX_04;
  undefined8 arginfo_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  optional<shared_ptr<Var>_> opt_varidx;
  optional<int32_t> opt_const;
  expected<Miss2Identifier,_Miss2Identifier::Error> opt_token;
  optional<std::pair<string_view,_bool>_> var_ident;
  ulong local_d0;
  undefined1 local_c8 [8];
  storage_t<std::shared_ptr<Var>_> local_c0;
  element_type *local_b0;
  optional<shared_ptr<Var>_> local_a8;
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  undefined1 local_80 [24];
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
  local_68;
  undefined1 local_50 [32];
  
  bVar4 = Miss2Identifier::is_identifier(&arg->ident,options);
  if (!bVar4) {
switchD_001669e9_caseD_0:
    peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00166a25:
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->contained).m_error.reason = InvalidIdentifier;
      return __return_storage_ptr__;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
    if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00166a25;
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__return_storage_ptr__->contained).m_error.reason = InvalidIdentifier;
    goto LAB_00167275;
  }
  local_b0 = (element_type *)arginfo;
  maybe_var_identifier((optional<std::pair<string_view,_bool>_> *)local_50,&arg->ident,arginfo);
  if (local_50[0] != true) {
LAB_00166a9b:
    peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00166adc:
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->contained).m_error.reason = NoSuchVar;
      return __return_storage_ptr__;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
    if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00166adc;
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__return_storage_ptr__->contained).m_error.reason = NoSuchVar;
    goto LAB_00167275;
  }
  Miss2Identifier::match
            ((expected<Miss2Identifier,_Miss2Identifier::Error> *)local_88,
             (string_view *)(local_50 + 8),options);
  if (local_88[0] == false) {
    switch(local_80._0_4_) {
    case 0:
      goto switchD_001669e9_caseD_0;
    case 1:
      peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00166d6f:
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexNesting;
        return __return_storage_ptr__;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count + 1;
      }
      if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00166d6f;
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count + 1;
      }
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexNesting;
      goto LAB_00167275;
    case 2:
      peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count + 1;
        }
        if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count + 1;
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexNegative;
          goto LAB_00167275;
        }
      }
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexNegative;
      return __return_storage_ptr__;
    case 3:
      peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count + 1;
        }
        if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count + 1;
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexOutOfRange;
          goto LAB_00167275;
        }
      }
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->contained).m_error.reason = IdentifierIndexOutOfRange;
      return __return_storage_ptr__;
    default:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(309)."
                );
      *(undefined ***)this = &PTR__runtime_error_002195e8;
      __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  SymTable::find_var((optional<shared_ptr<Var>_> *)local_c8,symtable,(string_view *)local_80,
                     scope_ptr);
  if (local_c8[0] != true) {
    if (local_50[0] == false) {
      __assert_fail("initialized()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                    ,0x1fb,
                    "T *std::experimental::optional<std::pair<libcxx_strviewclone::basic_string_view<char>, bool>>::operator->() [T = std::pair<libcxx_strviewclone::basic_string_view<char>, bool>]"
                   );
    }
    if ((bool)local_50[0x18] != true) goto LAB_00166a9b;
    peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count +
             1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count +
             1;
      }
      if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00166d99;
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count +
             1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count +
             1;
      }
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
           super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->contained).m_error.reason = ExpectedVar;
      goto LAB_0016725f;
    }
LAB_00166d99:
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedVar;
    goto LAB_00167269;
  }
  arginfo_00 = extraout_RDX;
  if (((bool)local_80[0x10] == true) &&
     (bVar4 = eggs::variants::detail::
              apply<bool,is<unsigned_long,eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>(eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>,false,true>const&>
                        ((anon_class_1_0_00000001 *)&local_a8,&local_68),
     arginfo_00 = extraout_RDX_00, bVar4)) {
    if ((bool)local_80[0x10] != false) {
      if (local_68.
          super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
          ._which != 1) {
        eggs::variants::detail::throw_bad_variant_access<unsigned_long&>();
      }
      bVar4 = true;
      bVar3 = true;
      local_d0 = local_68.
                 super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
                 .
                 super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                 .field_0._0_8_;
      goto LAB_00166afe;
    }
LAB_0016731e:
    __function = 
    "T &std::experimental::optional<eggs::variants::variant<unsigned long, libcxx_strviewclone::basic_string_view<char>>>::operator*() & [T = eggs::variants::variant<unsigned long, libcxx_strviewclone::basic_string_view<char>>]"
    ;
    goto LAB_00167333;
  }
  bVar4 = false;
  bVar3 = false;
  local_d0 = 0;
LAB_00166afe:
  if ((bool)local_80[0x10] == true) {
    bVar5 = eggs::variants::detail::
            apply<bool,is<unsigned_long,eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>(eggs::variants::variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>,false,true>const&>
                      ((anon_class_1_0_00000001 *)&local_a8,&local_68);
    arginfo_00 = extraout_RDX_01;
    if (bVar5) goto LAB_00166b1f;
    if ((bool)local_80[0x10] == false) goto LAB_0016731e;
    if (local_68.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true,_true>
        ._which != 2) {
      eggs::variants::detail::
      throw_bad_variant_access<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&>
                ();
    }
    SymTable::find_var(&local_a8,symtable,(string_view *)&local_68,scope_ptr);
    if ((anon_class_1_0_00000001)local_a8.super_OptionalBase<std::shared_ptr<Var>_>.init_ !=
        (anon_class_1_0_00000001)0x1) {
      Commands::find_constant_all((Commands *)local_90,(string_view *)commands);
      if (local_90[0] == '\x01') {
        if (options->pedantic != true) {
          bVar3 = true;
          if (bVar4) {
            bVar3 = bVar4;
          }
          local_d0 = (ulong)(int)local_90._4_4_;
          arginfo_00 = extraout_RDX_03;
          goto LAB_00166ec8;
        }
        peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 this_00;
            (__return_storage_ptr__->contained).m_error.reason = VariableIndexIsConstant;
            goto LAB_00167249;
          }
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = VariableIndexIsConstant;
      }
      else {
        peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 this_00;
            (__return_storage_ptr__->contained).m_error.reason = VariableIndexNotVar;
            goto LAB_00167249;
          }
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = VariableIndexNotVar;
      }
LAB_00167253:
      if ((anon_class_1_0_00000001)local_a8.super_OptionalBase<std::shared_ptr<Var>_>.init_ ==
          (anon_class_1_0_00000001)0x1) goto LAB_0016725f;
      goto LAB_00167269;
    }
    if ((local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type != Int) {
      peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               this_00;
          (__return_storage_ptr__->contained).m_error.reason = VariableIndexNotInt;
LAB_00167249:
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          goto LAB_00167253;
        }
      }
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
      (__return_storage_ptr__->contained).m_error.reason = VariableIndexNotInt;
      goto LAB_00167253;
    }
    arginfo_00 = extraout_RDX_02;
    if (((local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->count).
        super_OptionalBase<unsigned_int>.init_ == true) {
      peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               this_00;
          (__return_storage_ptr__->contained).m_error.reason = VariableIndexIsArray;
          goto LAB_00167249;
        }
      }
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
      (__return_storage_ptr__->contained).m_error.reason = VariableIndexIsArray;
      goto LAB_00167253;
    }
LAB_00166ec8:
    if (((anon_class_1_0_00000001)local_a8.super_OptionalBase<std::shared_ptr<Var>_>.init_ ==
         (anon_class_1_0_00000001)0x1) &&
       (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      arginfo_00 = extraout_RDX_04;
    }
LAB_00166ede:
    if (local_c8[0] != false) {
      uVar1 = *(ushort *)
               ((long)&(local_b0->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
                       super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1);
      if ((((uVar1 & 0x10) == 0) ||
          ((local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->global ==
           false)) &&
         ((RVar7 = VariableNotAllowed, (uVar1 & 0x20) == 0 ||
          (RVar7 = VariableKindNotAllowed,
          arginfo_00 = local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
          (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->global ==
          true)))) {
        RVar6 = VariableKindNotAllowed;
        if ((uVar1 & 0x10) == 0) {
          RVar6 = RVar7;
        }
        peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (__shared_count<(__gnu_cxx::_Lock_policy)2>)
             (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count + 1;
          }
          if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            (__return_storage_ptr__->contained).m_error.reason = RVar6;
LAB_0016725f:
            if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
            }
            goto LAB_00167269;
          }
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (__return_storage_ptr__->contained).m_error.reason = RVar6;
      }
      else {
        bVar4 = match_arg::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(local_c8 + 8),(shared_ptr<Var> *)local_b0,
                           (Arg *)arginfo_00);
        if (bVar4) {
          if (bVar3) {
            if (((local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->count
                ).super_OptionalBase<unsigned_int>.init_ == false) {
              peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (__shared_count<(__gnu_cxx::_Lock_policy)2>)
                   (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi)->_M_use_count + 1;
                }
                if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.
                                   value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.
                                   value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_M_use_count + 1;
                  }
                  __return_storage_ptr__->has_value = false;
                  (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
                  (__return_storage_ptr__->contained).m_error.context.
                  super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
                  (__return_storage_ptr__->contained).m_error.reason = VariableIsNotArray;
                  goto LAB_0016725f;
                }
              }
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
              (__return_storage_ptr__->contained).m_error.context.
              super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              (__return_storage_ptr__->contained).m_error.reason = VariableIsNotArray;
              goto LAB_00167269;
            }
            if (((local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->count
                ).super_OptionalBase<unsigned_int>.storage_.value_ <= local_d0) {
              peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (__shared_count<(__gnu_cxx::_Lock_policy)2>)
                   (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                  super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                 _M_pi)->_M_use_count + 1;
                }
                if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.
                                   value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                    super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.
                                   value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_M_use_count + 1;
                  }
                  __return_storage_ptr__->has_value = false;
                  (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
                  (__return_storage_ptr__->contained).m_error.context.
                  super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                         super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
                  (__return_storage_ptr__->contained).m_error.reason = VariableIndexOutOfRange;
                  goto LAB_0016725f;
                }
              }
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
              (__return_storage_ptr__->contained).m_error.context.
              super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              (__return_storage_ptr__->contained).m_error.reason = VariableIndexOutOfRange;
              goto LAB_00167269;
            }
          }
          __return_storage_ptr__->has_value = true;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b0;
        }
        else {
          peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
          super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (__shared_count<(__gnu_cxx::_Lock_policy)2>)
               (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
          if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
            }
            if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                       super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                       super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _M_use_count + 1;
              }
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
              (__return_storage_ptr__->contained).m_error.context.
              super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              (__return_storage_ptr__->contained).m_error.reason = VariableTypeMismatch;
              goto LAB_0016725f;
            }
          }
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
          (__return_storage_ptr__->contained).m_error.context.
          super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
               super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (__return_storage_ptr__->contained).m_error.reason = VariableTypeMismatch;
        }
      }
LAB_00167269:
      if (local_c8[0] != true) {
        return __return_storage_ptr__;
      }
LAB_00167275:
      if (local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      return __return_storage_ptr__;
    }
  }
  else {
LAB_00166b1f:
    if ((bool)local_80[0x10] != false) goto LAB_00166ede;
    if (local_c8[0] != false) {
      if (((local_c0.value_.super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->count).
          super_OptionalBase<unsigned_int>.init_ == true) {
        peVar2 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
        super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (__shared_count<(__gnu_cxx::_Lock_policy)2>)
             (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
            super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _M_use_count + 1;
          }
          if (local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
              super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                   super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_use_count + 1;
            }
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
            (__return_storage_ptr__->contained).m_error.context.
            super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
                 super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            (__return_storage_ptr__->contained).m_error.reason = ExpectedVarIndex;
            goto LAB_0016725f;
          }
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar2;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.super_OptionalBase<std::shared_ptr<Var>_>.storage_.value_.
             super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (__return_storage_ptr__->contained).m_error.reason = ExpectedVarIndex;
        goto LAB_00167269;
      }
      goto LAB_00166ede;
    }
  }
  __function = 
  "T &std::experimental::optional<std::shared_ptr<Var>>::operator*() & [T = std::shared_ptr<Var>]";
LAB_00167333:
  __assert_fail("initialized()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                ,0x204,__function);
}

Assistant:

static auto match_arg(const Commands& commands, const shared_ptr<const SyntaxTree>& hint,
                      const TagVar& arg, const Command::Arg& arginfo, const SymTable& symtable,
                      const shared_ptr<Scope>& scope_ptr, const Options& options) -> expected<const Command::Arg*, MatchFailure>
{
    auto var_matches = [](const shared_ptr<Var>& var, const Command::Arg& arginfo) -> bool
    {
        switch(var->type)
        {
            case VarType::Int:
                return (arginfo.type == ArgType::Integer
                     || arginfo.type == ArgType::Constant 
                     || arginfo.type == ArgType::Param 
                     || (arginfo.type == ArgType::String && arginfo.allow_pointer)
                     || (arginfo.type == ArgType::TextLabel && arginfo.allow_pointer)
                     || (arginfo.type == ArgType::TextLabel16 && arginfo.allow_pointer));
            case VarType::Float:
                return (arginfo.type == ArgType::Float || arginfo.type == ArgType::Param);
            case VarType::TextLabel:
                return (arginfo.type == ArgType::TextLabel
                    ||  arginfo.type == ArgType::String
                    || (arginfo.type == ArgType::Param && arginfo.allow_text_label));
            case VarType::TextLabel16:
                return (arginfo.type == ArgType::TextLabel16
                    ||  arginfo.type == ArgType::String
                    || (arginfo.type == ArgType::Param && arginfo.allow_text_label));
            default:
                Unreachable();
        }
    };

    if(!Miss2Identifier::is_identifier(arg.ident, options))
        return make_unexpected(MatchFailure{ hint, MatchFailure::InvalidIdentifier });

    if(auto var_ident = maybe_var_identifier(arg.ident, arginfo))
    {
        auto opt_token = Miss2Identifier::match(var_ident->first, options);
        if(!opt_token)
        {
            switch(opt_token.error())
            {
                case Miss2Identifier::InvalidIdentifier:return make_unexpected(MatchFailure{ hint, MatchFailure::InvalidIdentifier });
                case Miss2Identifier::NestingOfArrays:  return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexNesting });
                case Miss2Identifier::NegativeIndex:    return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexNegative });
                case Miss2Identifier::OutOfRange:       return make_unexpected(MatchFailure{ hint, MatchFailure::IdentifierIndexOutOfRange });
                default:                                Unreachable();
            }
        }

        auto& token = *opt_token;
        if(auto opt_var = symtable.find_var(token.identifier, scope_ptr))
        {
            optional<size_t> indexing;

            if(token.index != nullopt && is<size_t>(*token.index))
            {
                indexing = get<size_t>(*token.index);
            }
            if(token.index != nullopt && !is<size_t>(*token.index))
            {
                auto& index = get<string_view>(*token.index);
                if(auto opt_varidx = symtable.find_var(index, scope_ptr))
                {
                    if((*opt_varidx)->type != VarType::Int)
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexNotInt });
                    if((*opt_varidx)->count)
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexIsArray });
                }
                else if(auto opt_const = commands.find_constant_all(index))
                {
                    indexing = *opt_const;
                    if(options.pedantic) // TODO pedantic/warning instead of error
                        return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexIsConstant });
                }
                else
                {
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexNotVar });
                }
            }
            else if(token.index == nullopt && (*opt_var)->count != nullopt)
            {
                return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedVarIndex });
            }

            auto& var = *opt_var;
            if(!(arginfo.allow_global_var && var->global) && !(arginfo.allow_local_var && !var->global))
            {
                auto failure = arginfo.allow_global_var || arginfo.allow_local_var? MatchFailure::VariableKindNotAllowed :
                                                                                    MatchFailure::VariableNotAllowed;
                return make_unexpected(MatchFailure{ hint, failure });
            }

            if(!var_matches(var, arginfo))
                return make_unexpected(MatchFailure{ hint, MatchFailure::VariableTypeMismatch });

            if(indexing)
            {
                if(var->count == nullopt)
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIsNotArray });
                else if(*indexing >= *var->count)
                    return make_unexpected(MatchFailure{ hint, MatchFailure::VariableIndexOutOfRange });
            }

            return &arginfo;
        }
        else if(var_ident->second) // var not found, but required to find one?
        {
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedVar });
        }
    }

    return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchVar });
}